

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pattern.h
# Opt level: O0

void __thiscall enact::WildcardPattern::~WildcardPattern(WildcardPattern *this)

{
  WildcardPattern *this_local;
  
  (this->super_Pattern)._vptr_Pattern = (_func_int **)&PTR__WildcardPattern_0016a450;
  Token::~Token(&this->keyword);
  Pattern::~Pattern(&this->super_Pattern);
  return;
}

Assistant:

~WildcardPattern() override = default;